

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddCustomConstraint
          (ConstraintSet *this,shared_ptr<RigidBodyDynamics::Constraint> *customConstraint)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  element_type *peVar4;
  size_type sVar5;
  char *pcVar6;
  Scalar *pSVar7;
  long lVar8;
  undefined8 uVar9;
  string *text;
  ostream *this_00;
  undefined1 uVar10;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var11;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var12;
  stringstream errormsg;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> iter;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> iter_2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  iter_1;
  uint i;
  string nameStr;
  uint cIndex;
  uint rowsInG;
  uint insertAtRowInG;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffffb68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  allocator<char> *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  stringstream local_360 [16];
  ostream local_350 [376];
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  uint local_1c8;
  uint local_1c4;
  pair<unsigned_int,_unsigned_int> local_1c0;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_1b8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_1a8;
  undefined1 local_192;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_191;
  _Base_ptr local_170;
  undefined1 local_168;
  uint local_160;
  uint local_15c;
  pair<unsigned_int,_unsigned_int> local_158;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_150;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_140;
  undefined1 local_12a;
  _Base_ptr local_108;
  undefined1 local_100;
  int local_f4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  local_c8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  local_b8;
  undefined4 local_a4;
  uint local_a0;
  allocator<char> local_41;
  string local_40 [36];
  uint local_1c;
  int local_18;
  uint local_14;
  
  sVar3 = size((ConstraintSet *)0x6d4aa4);
  local_14 = (uint)sVar3;
  peVar4 = std::
           __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6d4ac6);
  uVar1 = Constraint::getConstraintSize(peVar4);
  local_18 = (uint)sVar3 + uVar1;
  sVar5 = std::
          vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
          ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_RDI + 200));
  local_1c = (uint)sVar5;
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::Constraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
              *)in_stack_fffffffffffffb70,
             (shared_ptr<RigidBodyDynamics::Constraint> *)in_stack_fffffffffffffb68);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
  ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                *)(in_RDI + 200),(ulong)local_1c);
  peVar4 = std::
           __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6d4b36);
  Constraint::addToConstraintSet(peVar4,local_14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  std::allocator<char>::~allocator(&local_41);
  std::__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6d4b92);
  pcVar6 = Constraint::getName((Constraint *)0x6d4b9a);
  if (pcVar6 != (char *)0x0) {
    std::
    __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6d4bbf);
    pcVar6 = Constraint::getName((Constraint *)0x6d4bc7);
    std::__cxx11::string::operator=(local_40,pcVar6);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Index)in_stack_fffffffffffffb58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Index)in_stack_fffffffffffffb58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Index)in_stack_fffffffffffffb58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Index)in_stack_fffffffffffffb58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Index)in_stack_fffffffffffffb58);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             in_stack_fffffffffffffb58);
  std::allocator<Vector3_t>::allocator((allocator<Vector3_t> *)0x6d4d0e);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
             CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             (size_type)in_stack_fffffffffffffb78,(value_type *)in_stack_fffffffffffffb70,
             (allocator_type *)in_stack_fffffffffffffb68);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator=
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffffb70,
             (vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffffb68);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::~vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffffb70);
  std::allocator<Vector3_t>::~allocator((allocator<Vector3_t> *)0x6d4d6b);
  local_a0 = 0;
  while( true ) {
    uVar1 = local_a0;
    peVar4 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d4d91);
    uVar2 = Constraint::getConstraintSize(peVar4);
    if (uVar2 <= uVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->first);
    local_a4 = 2;
    std::
    vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>::
    push_back((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
               *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
              (value_type *)in_stack_fffffffffffffb58);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        (Index)in_stack_fffffffffffffb58);
    *pSVar7 = 0.0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        (Index)in_stack_fffffffffffffb58);
    *pSVar7 = 0.0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        (Index)in_stack_fffffffffffffb58);
    *pSVar7 = 0.0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        (Index)in_stack_fffffffffffffb58);
    *pSVar7 = 0.0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        (Index)in_stack_fffffffffffffb58);
    *pSVar7 = 0.0;
    local_a0 = local_a0 + 1;
  }
  lVar8 = std::__cxx11::string::size();
  if (lVar8 != 0) {
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
    ::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool,_true>
              ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
                *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x20),sVar5 - 1);
    sVar5 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_RDI + 200));
    local_f4 = (int)sVar5 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_true>
              (in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->first,
               (uint *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    _Var11 = std::
             map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
             ::insert<std::pair<std::__cxx11::string,unsigned_int>>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    local_108 = (_Base_ptr)_Var11.first._M_node;
    local_100 = _Var11.second;
    local_c8.first._M_node = local_108;
    local_c8.second = (bool)local_100;
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
    ::operator=(&local_b8,&local_c8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x6d5099);
    if ((local_b8.second & 1U) == 0) {
      local_12a = 1;
      uVar9 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      Errors::RBDLError::RBDLError
                ((RBDLError *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb78);
      local_12a = 0;
      __cxa_throw(uVar9,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  peVar4 = std::
           __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6d51bf);
  uVar1 = Constraint::getUserDefinedId(peVar4);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar1 < uVar2) {
    std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::
    pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool,_true>
              ((pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    peVar4 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d520d);
    local_15c = Constraint::getUserDefinedId(peVar4);
    sVar5 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_RDI + 200));
    local_160 = (int)sVar5 - 1;
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
              (&local_158,&local_15c,&local_160);
    _Var12 = std::
             map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
             ::insert<std::pair<unsigned_int,unsigned_int>>
                       ((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)in_stack_fffffffffffffb70,
                        (pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffb68);
    local_170 = (_Base_ptr)_Var12.first._M_node;
    local_168 = _Var12.second;
    local_150.first._M_node = local_170;
    local_150.second = (bool)local_168;
    std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::operator=
              (&local_140,&local_150);
    if ((local_140.second & 1U) == 0) {
      local_192 = 1;
      pcVar6 = (char *)__cxa_allocate_exception(0x28);
      this_01 = &local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,pcVar6,in_stack_fffffffffffffb90);
      Errors::RBDLError::RBDLError
                ((RBDLError *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb78);
      local_192 = 0;
      __cxa_throw(pcVar6,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool,_true>
            ((pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  local_1c4 = local_18 - 1;
  sVar5 = std::
          vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
          ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_RDI + 200));
  local_1c8 = (int)sVar5 - 1;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            (&local_1c0,&local_1c4,&local_1c8);
  _Var12 = std::
           map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::insert<std::pair<unsigned_int,unsigned_int>>
                     ((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)in_stack_fffffffffffffb70,
                      (pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffb68);
  local_1d8 = (_Base_ptr)_Var12.first._M_node;
  uVar10 = _Var12.second;
  local_1d0 = uVar10;
  local_1b8.first._M_node = local_1d8;
  local_1b8.second = (bool)uVar10;
  std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::operator=
            (&local_1a8,&local_1b8);
  if ((local_1a8.second & 1U) != 0) {
    uVar1 = local_18 - 1;
    std::__cxx11::string::~string(local_40);
    return uVar1;
  }
  std::__cxx11::stringstream::stringstream(local_360);
  text = (string *)
         std::operator<<(local_350,"Error: Constraint row entry into system is not unique.");
  this_00 = std::operator<<((ostream *)text,
                            " (This should not be possible: contact the maintainer of this code.)");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  uVar9 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  Errors::RBDLError::RBDLError((RBDLError *)CONCAT17(uVar10,in_stack_fffffffffffffb80),text);
  __cxa_throw(uVar9,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddCustomConstraint(
  std::shared_ptr<Constraint> customConstraint)
{
  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+customConstraint->getConstraintSize();
  unsigned int cIndex = constraints.size();

  constraints.emplace_back(customConstraint);
  constraints[cIndex]->addToConstraintSet(insertAtRowInG);

  //Resize constraint set system variables
  std::string nameStr("");
  if(customConstraint->getName() != NULL) {
    nameStr = customConstraint->getName();
  }

  err.conservativeResize(     rowsInG);
  errd.conservativeResize(    rowsInG);
  force.conservativeResize (  rowsInG);
  impulse.conservativeResize (rowsInG);
  v_plus.conservativeResize ( rowsInG);
  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  for(unsigned int i=0; i<customConstraint->getConstraintSize(); ++i) {
    //The list of names, constraint types, and ids must have the same
    //number of entries as G has rows.
    name.push_back (nameStr);
    constraintType.push_back (ConstraintTypeCustom);


    err[      insertAtRowInG+i ] = 0.;
    errd[     insertAtRowInG+i ] = 0.;
    force[    insertAtRowInG+i ] = 0.;
    impulse[  insertAtRowInG+i ] = 0.;
    v_plus[   insertAtRowInG+i ] = 0.;
  }

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional name is not unique.\n");
    }

  }
  if(customConstraint->getUserDefinedId()
      < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          customConstraint->getUserDefinedId(),
                                          unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional userDefinedId is not unique.\n");
    }

  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry into system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;

}